

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O2

int Lpk_NodeCuts(Lpk_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *vNodes;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  Lpk_Cut_t *pCut;
  float fVar11;
  
  vNodes = p->vTemp;
  vNodes->nSize = 0;
  iVar4 = Abc_NodeMffcLabel(p->pObj,vNodes);
  p->nMffc = iVar4;
  if (iVar4 < 1) {
    __assert_fail("nMffc > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                  ,0x274,"int Lpk_NodeCuts(Lpk_Man_t *)");
  }
  if (iVar4 != 1) {
    pCut = p->pCuts;
    p->nCuts = 1;
    *(uint *)p->pCuts = (*(uint *)p->pCuts & 0xfffc0000) + 1;
    piVar9 = p->pCuts[0].pLeaves;
    p->pCuts[0].pLeaves[0] = p->pObj->Id;
    Lpk_NodeCutSignature(pCut);
    iVar4 = p->nCuts;
    for (lVar10 = 0; lVar10 < iVar4; lVar10 = lVar10 + 1) {
      if ((undefined1  [820])((undefined1  [820])pCut[lVar10] & (undefined1  [820])0x3f) !=
          (undefined1  [820])0x0) {
        uVar7 = 0;
        while (uVar7 < (*(uint *)(pCut + lVar10) & 0x3f)) {
          Lpk_NodeCutsOne(p,pCut + lVar10,piVar9[uVar7]);
          iVar4 = p->nCuts;
          uVar7 = uVar7 + 1;
          if (iVar4 == 10000) goto LAB_0041a6d0;
        }
        if (iVar4 == 10000) goto LAB_0041a6d0;
      }
      piVar9 = piVar9 + 0xcd;
    }
    if (iVar4 == 10000) {
LAB_0041a6d0:
      p->nNodesOver = p->nNodesOver + 1;
    }
    if (p->pPars->fSatur != 0) {
      Lpk_NodeRecordImpact(p);
    }
    p->nEvals = 0;
    for (lVar10 = 0; lVar10 < p->nCuts; lVar10 = lVar10 + 1) {
      uVar1 = *(uint *)pCut;
      if (1 < (uVar1 & 0x3f)) {
        iVar4 = (uVar1 & 0x3f) - 1;
        iVar8 = p->pPars->nLutSize + -1;
        uVar5 = (iVar4 / iVar8 + 1) - (uint)(iVar4 % iVar8 == 0) & 0x3f;
        *(uint *)pCut = uVar1 & 0xff03ffff | uVar5 << 0x12;
        fVar11 = (float)(int)((uVar1 >> 6 & 0x3f) - (uVar1 >> 0xc & 0x3f)) / (float)uVar5;
        pCut->Weight = fVar11;
        if (1.001 < fVar11) {
          iVar4 = Lpk_NodeCutsCheckDsd(p,pCut);
          *(uint *)pCut = *(uint *)pCut & 0xbfffffff | iVar4 << 0x1e;
          if (iVar4 == 0) {
            iVar4 = p->nEvals;
            p->nEvals = iVar4 + 1;
            p->pEvals[iVar4] = (int)lVar10;
          }
        }
      }
      pCut = pCut + 1;
    }
    iVar4 = p->nEvals;
    if (iVar4 != 0) {
      if (iVar4 < 2) {
        iVar4 = 1;
      }
      uVar7 = 0;
      bVar3 = false;
      do {
        while (bVar2 = bVar3, uVar6 = uVar7, iVar4 - 1 != uVar6) {
          iVar8 = p->pEvals[uVar6];
          uVar7 = uVar6 + 1;
          bVar3 = bVar2;
          if (p->pCuts[iVar8].Weight < p->pCuts[p->pEvals[uVar6 + 1]].Weight + -0.001) {
            p->pEvals[uVar6] = p->pEvals[uVar6 + 1];
            p->pEvals[uVar6 + 1] = iVar8;
            bVar3 = true;
          }
        }
        uVar7 = 0;
        bVar3 = false;
      } while (bVar2);
      return 1;
    }
  }
  return 0;
}

Assistant:

int Lpk_NodeCuts( Lpk_Man_t * p )
{
    Lpk_Cut_t * pCut, * pCut2;
    int i, k, Temp, nMffc, fChanges;
    //int nSupp;

    // mark the MFFC of the node with the current trav ID
    Vec_PtrClear( p->vTemp );
    nMffc = p->nMffc = Abc_NodeMffcLabel( p->pObj, p->vTemp );
    assert( nMffc > 0 );
    if ( nMffc == 1 )
        return 0;
/*
    // count the leaves
    nSupp = Lpk_CountSupp( p->pNtk, p->vTemp );
    if ( nMffc > 10 && nSupp <= 10 )
        printf( "Obj = %4d : Supp = %4d. Mffc = %4d.\n", p->pObj->Id, nSupp, nMffc );
*/
    // initialize the first cut
    pCut = p->pCuts; p->nCuts = 1;
    pCut->nNodes = 0; 
    pCut->nNodesDup = 0;
    pCut->nLeaves = 1;
    pCut->pLeaves[0] = p->pObj->Id;
    // assign the signature
    Lpk_NodeCutSignature( pCut );

    // perform the cut computation
    for ( i = 0; i < p->nCuts; i++ )
    {
        pCut = p->pCuts + i;
        if ( pCut->nLeaves == 0 )
            continue;

        // try to expand the fanins of this cut
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
        {
            // create a new cut
            Lpk_NodeCutsOne( p, pCut, pCut->pLeaves[k] );
            // quit if the number of cuts has exceeded the limit
            if ( p->nCuts == LPK_CUTS_MAX )
                break;
        }
        if ( p->nCuts == LPK_CUTS_MAX )
            break;
    }
    if ( p->nCuts == LPK_CUTS_MAX ) 
        p->nNodesOver++;

    // record the impact of this node
    if ( p->pPars->fSatur )
        Lpk_NodeRecordImpact( p );

    // compress the cuts by removing empty ones, those with negative Weight, and decomposable ones
    p->nEvals = 0;
    for ( i = 0; i < p->nCuts; i++ )
    {
        pCut = p->pCuts + i;
        if ( pCut->nLeaves < 2 )
            continue;
        // compute the minimum number of LUTs needed to implement this cut
        // V = N * (K-1) + 1  ~~~~~  N = Ceiling[(V-1)/(K-1)] = (V-1)/(K-1) + [(V-1)%(K-1) > 0]
        pCut->nLuts = Lpk_LutNumLuts( pCut->nLeaves, p->pPars->nLutSize ); 
//        pCut->Weight = (float)1.0 * (pCut->nNodes - pCut->nNodesDup - 1) / pCut->nLuts; //p->pPars->nLutsMax;
        pCut->Weight = (float)1.0 * (pCut->nNodes - pCut->nNodesDup) / pCut->nLuts; //p->pPars->nLutsMax;
        if ( pCut->Weight <= 1.001 )
//        if ( pCut->Weight <= 0.999 )
            continue;
        pCut->fHasDsd = Lpk_NodeCutsCheckDsd( p, pCut );
        if ( pCut->fHasDsd )
            continue;
        p->pEvals[p->nEvals++] = i;

//        if ( pCut->nLeaves <= 9 && pCut->nNodes > 15 )
//        printf( "%5d : Obj = %4d  Leaves = %4d  Nodes = %4d  LUTs = %4d\n", i, p->pObj->Id, pCut->nLeaves, pCut->nNodes, pCut->nLuts );
    }
    if ( p->nEvals == 0 )
        return 0;

    // sort the cuts by Weight
    do {
        fChanges = 0;
        for ( i = 0; i < p->nEvals - 1; i++ )
        {
            pCut = p->pCuts + p->pEvals[i];
            pCut2 = p->pCuts + p->pEvals[i+1];
            if ( pCut->Weight >= pCut2->Weight - 0.001 )
                continue;
            Temp = p->pEvals[i];
            p->pEvals[i] = p->pEvals[i+1];
            p->pEvals[i+1] = Temp;
            fChanges = 1;
        }
    } while ( fChanges );
/*
    for ( i = 0; i < p->nEvals; i++ )
    {
        pCut = p->pCuts + p->pEvals[i];
        printf( "Cut %3d : W = %5.2f.\n", i, pCut->Weight );
    }
    printf( "\n" );
*/
    return 1;
}